

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

void JX9_STDIN_Const(jx9_value *pVal,void *pUserData)

{
  undefined8 *puVar1;
  jx9_stream_data *pjVar2;
  
  puVar1 = *(undefined8 **)((long)pUserData + 0x4c8);
  if (puVar1 == (undefined8 *)0x0) {
    puVar1 = (undefined8 *)SyMemBackendAlloc((SyMemBackend *)pUserData,0x38);
    if (puVar1 == (undefined8 *)0x0) {
      puVar1 = (undefined8 *)0x0;
    }
    else {
      *puVar1 = &sjx9Stream;
      puVar1[3] = 0;
      puVar1[4] = 0;
      puVar1[2] = pUserData;
      *(undefined4 *)(puVar1 + 5) = 0;
      puVar1[6] = 0xfeac1400000000;
      pjVar2 = JX9StreamDataInit((jx9_vm *)pUserData,1);
      puVar1[1] = pjVar2;
      *(undefined8 **)((long)pUserData + 0x4c8) = puVar1;
    }
  }
  jx9MemObjRelease(pVal);
  (pVal->x).iVal = (sxi64)puVar1;
  pVal->iFlags = pVal->iFlags & 0xfffffe90U | 0x100;
  return;
}

Assistant:

static void JX9_STDIN_Const(jx9_value *pVal, void *pUserData)
{
	jx9_vm *pVm = (jx9_vm *)pUserData;
	void *pResource;
	pResource = jx9ExportStdin(pVm);
	jx9_value_resource(pVal, pResource);
}